

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  allocator_type *alloc_00;
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_RDI;
  AssertionResult gtest_ar__12;
  int i_1;
  int i;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  TypeParam ht3;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> alloc;
  hasher hasher;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8f0;
  int in_stack_fffffffffffff8f4;
  undefined4 uVar14;
  undefined1 in_stack_fffffffffffff8f8;
  undefined1 in_stack_fffffffffffff8f9;
  undefined1 in_stack_fffffffffffff8fa;
  allocator_type *in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff908;
  undefined1 in_stack_fffffffffffff90c;
  undefined1 in_stack_fffffffffffff90d;
  undefined1 in_stack_fffffffffffff90e;
  undefined1 in_stack_fffffffffffff90f;
  undefined4 in_stack_fffffffffffff918;
  Type type;
  string local_6c0 [16];
  char *in_stack_fffffffffffff950;
  char *in_stack_fffffffffffff958;
  char *in_stack_fffffffffffff960;
  value_type *in_stack_fffffffffffff968;
  undefined7 in_stack_fffffffffffff970;
  undefined1 in_stack_fffffffffffff977;
  AssertionResult local_688 [4];
  int local_63c;
  int local_5fc;
  string local_5f8 [55];
  undefined1 local_5c1;
  AssertionResult local_5c0 [4];
  string local_578 [55];
  byte local_541;
  AssertionResult local_540;
  string local_530 [55];
  undefined1 local_4f9;
  AssertionResult local_4f8 [4];
  string local_4b0 [55];
  byte local_479;
  AssertionResult local_478;
  string local_468 [55];
  undefined1 local_431;
  AssertionResult local_430 [9];
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_398;
  Hasher local_384;
  string local_378 [55];
  undefined1 local_341;
  AssertionResult local_340;
  string local_330 [55];
  byte local_2f9;
  AssertionResult local_2f8;
  string local_2e8 [55];
  undefined1 local_2b1;
  AssertionResult local_2b0;
  allocator_type *local_2a0;
  string local_298 [55];
  byte local_261;
  AssertionResult local_260;
  string local_250 [55];
  undefined1 local_219;
  AssertionResult local_218;
  string local_208 [55];
  byte local_1d1;
  AssertionResult local_1d0;
  string local_1c0 [55];
  undefined1 local_189;
  AssertionResult local_188;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_178;
  Hasher local_168;
  Hasher local_15c [13];
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_b8;
  Hasher local_a8;
  Hasher local_9c [13];
  
  type = kSuccess;
  Hasher::Hasher(local_9c,0);
  Hasher::Hasher(&local_a8,type);
  this_00 = (HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             *)(ulong)type;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_b8,type,(int *)this_00);
  google::
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (this_00,CONCAT44(type,in_stack_fffffffffffff918),(hasher *)in_RDI,
             (key_equal *)
             CONCAT17(in_stack_fffffffffffff90f,
                      CONCAT16(in_stack_fffffffffffff90e,
                               CONCAT15(in_stack_fffffffffffff90d,
                                        CONCAT14(in_stack_fffffffffffff90c,in_stack_fffffffffffff908
                                                )))),in_stack_fffffffffffff900);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_b8);
  Hasher::Hasher(local_15c,0);
  Hasher::Hasher(&local_168,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_178,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (this_00,CONCAT44(type,in_stack_fffffffffffff918),(hasher *)in_RDI,
             (key_equal *)
             CONCAT17(in_stack_fffffffffffff90f,
                      CONCAT16(in_stack_fffffffffffff90e,
                               CONCAT15(in_stack_fffffffffffff90d,
                                        CONCAT14(in_stack_fffffffffffff90c,in_stack_fffffffffffff908
                                                )))),in_stack_fffffffffffff900);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_178);
  uVar1 = google::
          BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                       in_stack_fffffffffffff8e8);
  local_189 = uVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
             (bool *)in_stack_fffffffffffff8e8,(type *)0xf009c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_188);
  if (!bVar2) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)in_RDI,
               CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffff90e,
                                       CONCAT11(in_stack_fffffffffffff90d,in_stack_fffffffffffff90c)
                                      )),(char *)in_stack_fffffffffffff900);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (Message *)in_stack_fffffffffffff968);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    std::__cxx11::string::~string(local_1c0);
    testing::Message::~Message((Message *)0xf00b04);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf00b98);
  uVar3 = google::
          BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                       in_stack_fffffffffffff8e8);
  local_1d1 = ~uVar3 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
             (bool *)in_stack_fffffffffffff8e8,(type *)0xf00bd6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1d0);
  if (!bVar2) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)in_RDI,
               CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(in_stack_fffffffffffff90d,
                                                      in_stack_fffffffffffff90c))),
               (char *)in_stack_fffffffffffff900);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (Message *)in_stack_fffffffffffff968);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    std::__cxx11::string::~string(local_208);
    testing::Message::~Message((Message *)0xf00cab);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf00d3f);
  uVar4 = google::
          BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                       in_stack_fffffffffffff8e8);
  local_219 = uVar4;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
             (bool *)in_stack_fffffffffffff8e8,(type *)0xf00d80);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_218);
  if (!bVar2) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)in_RDI,
               CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,in_stack_fffffffffffff90c))),
               (char *)in_stack_fffffffffffff900);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (Message *)in_stack_fffffffffffff968);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    std::__cxx11::string::~string(local_250);
    testing::Message::~Message((Message *)0xf00e55);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf00ee9);
  uVar5 = google::
          BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                       in_stack_fffffffffffff8e8);
  local_261 = ~uVar5 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
             (bool *)in_stack_fffffffffffff8e8,(type *)0xf00f2c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_260);
  if (!bVar2) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)in_RDI,
               CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),
               (char *)in_stack_fffffffffffff900);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (Message *)in_stack_fffffffffffff968);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    std::__cxx11::string::~string(local_298);
    testing::Message::~Message((Message *)0xf01001);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf01098);
  alloc_00 = (allocator_type *)
             HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_RDI,CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))));
  local_2a0 = alloc_00;
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                    (key_type *)in_stack_fffffffffffff8e8);
  uVar6 = google::
          BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                       in_stack_fffffffffffff8e8);
  local_2b1 = uVar6;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
             (bool *)in_stack_fffffffffffff8e8,(type *)0xf01113);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2b0);
  if (!bVar2) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)in_RDI,
               CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),(char *)alloc_00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (Message *)in_stack_fffffffffffff968);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    std::__cxx11::string::~string(local_2e8);
    testing::Message::~Message((Message *)0xf011e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0127c);
  uVar7 = google::
          BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                       in_stack_fffffffffffff8e8);
  local_2f9 = ~uVar7 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
             (bool *)in_stack_fffffffffffff8e8,(type *)0xf012bf);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2f8);
  if (!bVar2) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)in_RDI,
               CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),(char *)alloc_00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (Message *)in_stack_fffffffffffff968);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    std::__cxx11::string::~string(local_330);
    testing::Message::~Message((Message *)0xf01394);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf01428);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::resize((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
           (size_type)in_stack_fffffffffffff8e8);
  uVar8 = google::
          BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                       in_stack_fffffffffffff8e8);
  local_341 = uVar8;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
             (bool *)in_stack_fffffffffffff8e8,(type *)0xf0147d);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_340);
  if (!bVar2) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)in_RDI,
               CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),(char *)alloc_00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (Message *)in_stack_fffffffffffff968);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    std::__cxx11::string::~string(local_378);
    testing::Message::~Message((Message *)0xf01552);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf015e9);
  Hasher::Hasher(&local_384,1);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_398,2,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (this_00,CONCAT44(type,in_stack_fffffffffffff918),(hasher *)in_RDI,
             (key_equal *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,in_stack_fffffffffffff908))
                                    )),alloc_00);
  uVar9 = google::
          BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                       in_stack_fffffffffffff8e8);
  local_431 = uVar9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
             (bool *)in_stack_fffffffffffff8e8,(type *)0xf0167d);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_430);
  if (!bVar2) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)in_RDI,
               CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),(char *)alloc_00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (Message *)in_stack_fffffffffffff968);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    std::__cxx11::string::~string(local_468);
    testing::Message::~Message((Message *)0xf01784);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf01818);
  uVar10 = google::
           BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                        in_stack_fffffffffffff8e8);
  local_479 = ~uVar10 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
             (bool *)in_stack_fffffffffffff8e8,(type *)0xf0185b);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_478);
  if (!bVar2) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)in_RDI,
               CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),(char *)alloc_00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (Message *)in_stack_fffffffffffff968);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    std::__cxx11::string::~string(local_4b0);
    testing::Message::~Message((Message *)0xf01930);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf019c7);
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(uVar10,
                                                  CONCAT12(in_stack_fffffffffffff8fa,
                                                           CONCAT11(in_stack_fffffffffffff8f9,
                                                                    in_stack_fffffffffffff8f8)))))))
                 ,in_stack_fffffffffffff8f4);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
           in_stack_fffffffffffff968);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xf01a0c);
  uVar11 = google::
           BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                        in_stack_fffffffffffff8e8);
  local_4f9 = uVar11;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
             (bool *)in_stack_fffffffffffff8e8,(type *)0xf01a4d);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_4f8);
  if (!bVar2) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)in_RDI,
               CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),(char *)alloc_00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (Message *)in_stack_fffffffffffff968);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    std::__cxx11::string::~string(local_530);
    testing::Message::~Message((Message *)0xf01b48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf01bdc);
  uVar12 = google::
           BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                        in_stack_fffffffffffff8e8);
  local_541 = ~uVar12 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
             (bool *)in_stack_fffffffffffff8e8,(type *)0xf01c1f);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_540);
  if (!bVar2) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)in_RDI,
               CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),(char *)alloc_00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (Message *)in_stack_fffffffffffff968);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    std::__cxx11::string::~string(local_578);
    testing::Message::~Message((Message *)0xf01cf4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf01d8b);
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(uVar10,
                                                  CONCAT12(uVar11,CONCAT11(uVar12,
                                                  in_stack_fffffffffffff8f8))))))),
                 in_stack_fffffffffffff8f4);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
           in_stack_fffffffffffff968);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xf01dd0);
  uVar13 = google::
           BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                        in_stack_fffffffffffff8e8);
  local_5c1 = uVar13;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
             (bool *)in_stack_fffffffffffff8e8,(type *)0xf01e11);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_5c0);
  if (!bVar2) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)in_RDI,
               CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),(char *)alloc_00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (Message *)in_stack_fffffffffffff968);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    std::__cxx11::string::~string(local_5f8);
    testing::Message::~Message((Message *)0xf01f0c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf01fa3);
  for (local_5fc = 3; local_5fc < 0x7d1; local_5fc = local_5fc + 1) {
    HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(uVar10,
                                                  CONCAT12(uVar11,CONCAT11(uVar12,uVar13))))))),
                   in_stack_fffffffffffff8f4);
    google::
    BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
             in_stack_fffffffffffff968);
    std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xf02006);
  }
  for (local_63c = 2000; 2 < local_63c; local_63c = local_63c + -1) {
    HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(uVar10,
                                                  CONCAT12(uVar11,CONCAT11(uVar12,uVar13))))))),
                   in_stack_fffffffffffff8f4);
    google::
    BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
             in_stack_fffffffffffff968);
    std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xf020b1);
  }
  uVar6 = google::
          BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                       in_stack_fffffffffffff8e8);
  uVar14 = CONCAT13(uVar6,(int3)in_stack_fffffffffffff8f4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar14,in_stack_fffffffffffff8f0),
             (bool *)in_stack_fffffffffffff8e8,(type *)0xf0212b);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_688);
  if (!bVar2) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff968,in_stack_fffffffffffff960,
               in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)in_RDI,
               CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(uVar4,uVar5))),(char *)alloc_00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffff970),
               (Message *)in_stack_fffffffffffff968);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(uVar14,in_stack_fffffffffffff8f0));
    std::__cxx11::string::~string(local_6c0);
    testing::Message::~Message((Message *)0xf021dc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf02267);
  google::
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xf02274);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_398);
  google::
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xf0228e);
  google::
  HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xf0229b);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}